

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BERDecode.cpp
# Opt level: O3

int __thiscall OpaqueType::fromBuffer(OpaqueType *this,uint8_t *buf,size_t max_len)

{
  int iVar1;
  uint uVar2;
  uint8_t *__dest;
  
  uVar2 = BER_CONTAINER::fromBuffer(&this->super_BER_CONTAINER,buf,max_len);
  if (-1 < (int)uVar2) {
    iVar1 = (this->super_BER_CONTAINER)._length;
    __dest = (uint8_t *)calloc((long)iVar1,1);
    this->_value = __dest;
    memcpy(__dest,buf + uVar2,(long)iVar1);
    this->_dataLength = iVar1;
    uVar2 = uVar2 + iVar1;
  }
  return uVar2;
}

Assistant:

int OpaqueType::fromBuffer(const uint8_t *buf, size_t max_len){
    int i = BER_CONTAINER::fromBuffer(buf, max_len);
    CHECK_DECODE_ERR(i);
    const uint8_t* ptr = buf + i;

    _value = (uint8_t*)calloc(_length, sizeof(char));
    memcpy(_value, (char*)ptr, _length);
    _dataLength = _length;

    return _length + i;
}